

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapePoolingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  LogMessage *pLVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar6;
  ShapeRange *pSVar7;
  LayerUnion LVar8;
  runtime_error *this_02;
  size_t sVar9;
  size_t sVar10;
  ValidPadding *pVVar11;
  long lVar12;
  PoolingLayerParams_ValidCompletePadding *pPVar13;
  WeightParams *pWVar14;
  BoxCoordinatesMode *pBVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  BorderAmounts *pBVar20;
  int local_ec;
  int local_e4;
  LogMessage local_c8;
  ShapeRange local_90;
  ShapeRange local_70;
  ShapeRange local_50;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar6 = ShapeConstraint::sequenceRange(this_01);
  pSVar7 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_c8,pSVar6,pSVar7);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_c8);
  pSVar6 = ShapeConstraint::batchRange(this_01);
  pSVar7 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_c8,pSVar6,pSVar7);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&local_c8);
  pSVar6 = ShapeConstraint::channelRange(this_00);
  ShapeConstraint::updateChannelRange(this_01,pSVar6);
  pSVar6 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar6);
  if (specLayer->_oneof_case_[0] == 0x78) {
    LVar8 = specLayer->layer_;
  }
  else {
    LVar8.pooling_ = Specification::PoolingLayerParams::default_instance();
  }
  iVar2 = ((LVar8.convolution_)->kernelsize_).current_size_;
  if (iVar2 == 0) {
    iVar2 = 3;
    local_e4 = 3;
  }
  else {
    if (iVar2 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      iVar2 = ((LVar8.convolution_)->kernelsize_).current_size_;
    }
    pWVar14 = (LVar8.innerproduct_)->bias_;
    local_e4 = *(int *)&(pWVar14->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                        .ptr_;
    if (iVar2 < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      pWVar14 = (LVar8.innerproduct_)->bias_;
    }
    iVar2 = (pWVar14->floatvalue_).current_size_;
  }
  iVar3 = ((LVar8.convolution_)->stride_).current_size_;
  if (iVar3 == 0) {
    iVar3 = 1;
    iVar17 = 1;
  }
  else {
    if (iVar3 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      iVar3 = ((LVar8.convolution_)->stride_).current_size_;
    }
    pBVar15 = (LVar8.cropresize_)->boxindicesmode_;
    iVar17 = *(int *)&(pBVar15->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                      .ptr_;
    if (iVar3 < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      pBVar15 = (LVar8.cropresize_)->boxindicesmode_;
    }
    iVar3 = pBVar15->boxmode_;
  }
  if ((LVar8.pooling_)->globalpooling_ == true) {
    ShapeConstraint::setHeight(this_01,1);
    ShapeConstraint::setWidth(this_01,1);
    return;
  }
  uVar1 = (LVar8.scale_)->_cached_size_;
  if (0x1e < (int)uVar1) {
    if (uVar1 == 0x1f) {
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator-(&local_70,pSVar6,1);
      ShapeRange::operator/(&local_90,&local_70,(long)iVar17);
      ShapeRange::operator+((ShapeRange *)&local_c8,&local_90,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_c8);
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator-(&local_70,pSVar6,1);
      goto code_r0x00551b7b;
    }
    if (uVar1 != 0x20) {
      return;
    }
    pPVar13 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->includelastpixel_;
    local_ec = 0;
    iVar18 = (pPVar13->paddingamounts_).current_size_;
    iVar4 = 0;
    iVar16 = 0;
    if (iVar18 == 0) goto LAB_00551c91;
    if (iVar18 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      iVar16 = (int)((pPVar13->paddingamounts_).rep_)->elements[0];
      if ((LVar8.pooling_)->_oneof_case_[0] == 0x20) goto LAB_00551c3b;
      pPVar13 = Specification::PoolingLayerParams_ValidCompletePadding::default_instance();
    }
    else {
      iVar16 = (int)((pPVar13->paddingamounts_).rep_)->elements[0];
LAB_00551c3b:
      pPVar13 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->includelastpixel_;
    }
    if ((pPVar13->paddingamounts_).current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
    }
    iVar4 = *(int *)&(pPVar13->paddingamounts_).rep_[1].arena;
LAB_00551c91:
    if (iVar16 != 0 || iVar4 != 0) {
      sVar9 = ShapeConstraint::minimumHeight(this_00);
      sVar10 = ShapeConstraint::minimumHeight(this_00);
      local_ec = -(uint)((int)sVar10 + iVar16 <=
                        ((iVar17 + iVar16) * 2 - local_e4) + (int)sVar9 + -2);
    }
    pSVar6 = ShapeConstraint::heightRange(this_00);
    ShapeRange::operator+(&local_50,pSVar6,-(local_e4 + iVar16 * -2));
    ShapeRange::divideAndRoundUp(&local_70,&local_50,(long)iVar17);
    ShapeRange::operator+(&local_90,&local_70,1);
    ShapeRange::operator+((ShapeRange *)&local_c8,&local_90,local_ec);
    ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_c8);
    uVar19 = local_e4 + iVar16 * -2;
    if (uVar19 != 0 && SBORROW4(local_e4,iVar16 * 2) == (int)uVar19 < 0) {
      pSVar6 = ShapeConstraint::heightRange(this_01);
      sVar9 = ShapeRange::minimumValue(pSVar6);
      ShapeConstraint::lowerBoundHeight(this_00,(uVar19 + sVar9) - 1);
    }
    if (iVar16 == 0 && iVar4 == 0) {
      iVar17 = 0;
    }
    else {
      sVar9 = ShapeConstraint::minimumWidth(this_00);
      sVar10 = ShapeConstraint::minimumWidth(this_00);
      iVar17 = -(uint)((int)sVar10 + iVar4 <= ((iVar3 + iVar4) * 2 - iVar2) + (int)sVar9 + -2);
    }
    pSVar6 = ShapeConstraint::widthRange(this_00);
    ShapeRange::operator+(&local_50,pSVar6,-(iVar2 + iVar4 * -2));
    ShapeRange::divideAndRoundUp(&local_70,&local_50,(long)iVar3);
    ShapeRange::operator+(&local_90,&local_70,1);
    ShapeRange::operator+((ShapeRange *)&local_c8,&local_90,iVar17);
    ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)&local_c8);
    uVar19 = iVar2 + iVar4 * -2;
    if (uVar19 == 0 || SBORROW4(iVar2,iVar4 * 2) != (int)uVar19 < 0) {
      return;
    }
    pSVar6 = ShapeConstraint::widthRange(this_01);
    sVar9 = ShapeRange::minimumValue(pSVar6);
    ShapeConstraint::lowerBoundHeight(this_00,(uVar19 + sVar9) - 1);
    return;
  }
  if (uVar1 != 0x1e) {
    if (uVar1 != 0) {
      return;
    }
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Pooling padding type not set");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar20 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->valid_->paddingamounts_;
  if (pBVar20 == (BorderAmounts *)0x0) {
    pBVar20 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  iVar18 = (pBVar20->borderamounts_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar18 == 0) {
    local_ec = 0;
    iVar16 = 0;
    iVar18 = 0;
  }
  else {
    if (iVar18 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
      iVar18 = *(int *)((long)((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements
                              [0] + 0x10);
      if ((LVar8.pooling_)->_oneof_case_[0] == 0x1e) goto LAB_00551ec3;
      pVVar11 = Specification::ValidPadding::default_instance();
    }
    else {
      iVar18 = *(int *)((long)((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements
                              [0] + 0x10);
LAB_00551ec3:
      pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->valid_;
    }
    pBVar20 = pVVar11->paddingamounts_;
    if (pBVar20 == (BorderAmounts *)0x0) {
      pBVar20 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    if ((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
    }
    iVar4 = *(int *)((long)((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                    + 0x18);
    if ((LVar8.pooling_)->_oneof_case_[0] == 0x1e) {
      pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->valid_;
    }
    else {
      pVVar11 = Specification::ValidPadding::default_instance();
    }
    pBVar20 = pVVar11->paddingamounts_;
    if (pBVar20 == (BorderAmounts *)0x0) {
      pBVar20 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    if ((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
    }
    local_ec = *(int *)(*(long *)((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) +
                       0x10);
    if ((LVar8.pooling_)->_oneof_case_[0] == 0x1e) {
      pVVar11 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->valid_;
    }
    else {
      pVVar11 = Specification::ValidPadding::default_instance();
    }
    pBVar20 = pVVar11->paddingamounts_;
    if (pBVar20 == (BorderAmounts *)0x0) {
      pBVar20 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    if ((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_c8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
    }
    iVar16 = *(int *)(*(long *)((pBVar20->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) +
                     0x18);
    iVar18 = iVar18 + iVar4;
  }
  if (0 < local_e4 - iVar18) {
    pSVar6 = ShapeConstraint::heightRange(this_01);
    sVar9 = ShapeRange::minimumValue(pSVar6);
    if (sVar9 == 0) {
      lVar12 = 0;
    }
    else {
      pSVar6 = ShapeConstraint::heightRange(this_01);
      sVar9 = ShapeRange::minimumValue(pSVar6);
      lVar12 = sVar9 - 1;
    }
    ShapeConstraint::lowerBoundHeight(this_00,(ulong)(uint)(local_e4 - iVar18) + lVar12 * iVar17);
  }
  pSVar6 = ShapeConstraint::heightRange(this_00);
  ShapeRange::operator+(&local_70,pSVar6,iVar18 - local_e4);
  ShapeRange::operator/(&local_90,&local_70,(long)iVar17);
  ShapeRange::operator+((ShapeRange *)&local_c8,&local_90,1);
  ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_c8);
  uVar19 = iVar2 - (iVar16 + local_ec);
  if (0 < (int)uVar19) {
    pSVar6 = ShapeConstraint::widthRange(this_01);
    sVar9 = ShapeRange::minimumValue(pSVar6);
    if (sVar9 == 0) {
      lVar12 = 0;
    }
    else {
      pSVar6 = ShapeConstraint::widthRange(this_01);
      sVar9 = ShapeRange::minimumValue(pSVar6);
      lVar12 = sVar9 - 1;
    }
    ShapeConstraint::lowerBoundWidth(this_00,(ulong)uVar19 + lVar12 * iVar3);
  }
  pSVar6 = ShapeConstraint::widthRange(this_00);
  ShapeRange::operator+(&local_70,pSVar6,(iVar16 + local_ec) - iVar2);
code_r0x00551b7b:
  ShapeRange::operator/(&local_90,&local_70,(long)iVar3);
  ShapeRange::operator+((ShapeRange *)&local_c8,&local_90,1);
  ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)&local_c8);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePoolingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(inputShape.channelRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    const Specification::PoolingLayerParams& pool = specLayer.pooling();

    int Kh, Kw, hstride, wstride;
    Kh = Kw = 3;
    hstride = wstride = 1;
    if (pool.kernelsize_size() != 0){
        Kh = static_cast<int>(pool.kernelsize(0)); //height
        Kw = static_cast<int>(pool.kernelsize(1)); //width
    }
    if (pool.stride_size() != 0){
        hstride = static_cast<int>(pool.stride(0)); //height
        wstride = static_cast<int>(pool.stride(1)); //width
    }

    int l, r, b, t;
    l = r = b = t = 0;

    if (pool.globalpooling()) {
        outputShape.setHeight(1);
        outputShape.setWidth(1);
    } else {
        switch (pool.PoolingPaddingType_case()) {
            case Specification::PoolingLayerParams::kValid:
                if (pool.valid().paddingamounts().borderamounts_size() != 0){
                    t = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).startedgesize());
                    b = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).endedgesize());
                    l = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).startedgesize());
                    r = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).endedgesize());
                }

                if (Kh - b - t > 0) {
                    size_t inputLowerBound = outputShape.heightRange().minimumValue() == 0 ? 0 : (outputShape.heightRange().minimumValue() - 1);
                    inputShape.lowerBoundHeight(inputLowerBound * static_cast<size_t>(hstride) + static_cast<size_t>(Kh - b - t));
//                    inputShape.lowerBoundHeight(inputLowerBound + static_cast<size_t>(Kh - b - t));
                }

                outputShape.updateHeightRange((inputShape.heightRange() + (t + b - Kh))/static_cast<size_t>(hstride) + 1);

                if (Kw - l - r > 0) {
                    size_t inputLowerBound = outputShape.widthRange().minimumValue() == 0 ? 0 : (outputShape.widthRange().minimumValue() - 1);
                    inputShape.lowerBoundWidth(inputLowerBound * static_cast<size_t>(wstride) + static_cast<size_t>(Kw - l - r));
//                    inputShape.lowerBoundWidth(inputLowerBound + static_cast<size_t>(Kw - l - r));
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (r + l - Kw))/static_cast<size_t>(wstride) + 1);

                break;
            case Specification::PoolingLayerParams::kSame:
                // needs to round up
                outputShape.updateHeightRange((inputShape.heightRange() - 1)/ static_cast<size_t>(hstride) + 1);
                outputShape.updateWidthRange((inputShape.widthRange() - 1) / static_cast<size_t>(wstride) + 1);
                break;
            case Specification::PoolingLayerParams::kIncludeLastPixel: {
                if (pool.includelastpixel().paddingamounts_size() != 0){
                    t = static_cast<int>(pool.includelastpixel().paddingamounts(0));
                    l = static_cast<int>(pool.includelastpixel().paddingamounts(1));
                }
                // subtracting in the numerator and adding 1 in order to get integer division rounded up
                int addExtra = 0;
                if (t || l) {
                    if ((static_cast<int>(inputShape.minimumHeight()) - 1 + (2*t - Kh - 1) + 2 * hstride) >= (static_cast<int>(inputShape.minimumHeight()) + t)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateHeightRange((inputShape.heightRange() + (2*t - Kh)).divideAndRoundUp(static_cast<size_t>(hstride)) + 1 + addExtra);
                if (Kh - 2*t > 0)
                    inputShape.lowerBoundHeight(outputShape.heightRange().minimumValue() - 1 + static_cast<size_t>(Kh - 2*t));

                addExtra = 0;
                if (t || l){
                    if ((static_cast<int>(inputShape.minimumWidth()) - 1 + (2*l - Kw - 1) + 2 * wstride) >= (static_cast<int>(inputShape.minimumWidth()) + l)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (2*l - Kw)).divideAndRoundUp(static_cast<size_t>(wstride)) + 1 + addExtra);
                if (Kw - 2*l > 0)
                    inputShape.lowerBoundHeight(outputShape.widthRange().minimumValue() - 1 + static_cast<size_t>(Kw - 2*l));
                break;
            }
            case Specification::PoolingLayerParams::POOLINGPADDINGTYPE_NOT_SET:
                throw std::runtime_error("Pooling padding type not set");
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}